

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# IFCCurve.cpp
# Opt level: O0

size_t __thiscall
Assimp::IFC::anon_unknown_9::CompositeCurve::EstimateSampleCount
          (CompositeCurve *this,IfcFloat a,IfcFloat b)

{
  bool bVar1;
  int iVar2;
  element_type *peVar3;
  double *pdVar4;
  undefined4 extraout_var;
  double extraout_XMM0_Qa;
  IfcFloat local_c0;
  double local_b0;
  double local_98;
  double local_90;
  IfcFloat bt;
  double local_80;
  double local_78;
  IfcFloat at;
  IfcFloat delta;
  IfcFloat local_60;
  double *local_58;
  ParamRange *range;
  CurveEntry *entry;
  const_iterator __end3;
  const_iterator __begin3;
  vector<std::pair<std::shared_ptr<Assimp::IFC::BoundedCurve>,_bool>,_std::allocator<std::pair<std::shared_ptr<Assimp::IFC::BoundedCurve>,_bool>_>_>
  *__range3;
  IfcFloat acc;
  size_t cnt;
  IfcFloat b_local;
  IfcFloat a_local;
  CompositeCurve *this_local;
  
  local_c0 = b;
  bVar1 = Curve::InRange((Curve *)this,a);
  if (!bVar1) {
    __assert_fail("InRange( a )",
                  "/workspace/llm4binary/github/license_all_cmakelists_25/wbrbr[P]realtime/external/assimp/code/Importer/IFC/IFCCurve.cpp"
                  ,0x104,
                  "virtual size_t Assimp::IFC::(anonymous namespace)::CompositeCurve::EstimateSampleCount(IfcFloat, IfcFloat) const"
                 );
  }
  bVar1 = Curve::InRange((Curve *)this,b);
  if (!bVar1) {
    __assert_fail("InRange( b )",
                  "/workspace/llm4binary/github/license_all_cmakelists_25/wbrbr[P]realtime/external/assimp/code/Importer/IFC/IFCCurve.cpp"
                  ,0x105,
                  "virtual size_t Assimp::IFC::(anonymous namespace)::CompositeCurve::EstimateSampleCount(IfcFloat, IfcFloat) const"
                 );
  }
  acc = 0.0;
  __range3 = (vector<std::pair<std::shared_ptr<Assimp::IFC::BoundedCurve>,_bool>,_std::allocator<std::pair<std::shared_ptr<Assimp::IFC::BoundedCurve>,_bool>_>_>
              *)0x0;
  __end3 = std::
           vector<std::pair<std::shared_ptr<Assimp::IFC::BoundedCurve>,_bool>,_std::allocator<std::pair<std::shared_ptr<Assimp::IFC::BoundedCurve>,_bool>_>_>
           ::begin(&this->curves);
  entry = (CurveEntry *)
          std::
          vector<std::pair<std::shared_ptr<Assimp::IFC::BoundedCurve>,_bool>,_std::allocator<std::pair<std::shared_ptr<Assimp::IFC::BoundedCurve>,_bool>_>_>
          ::end(&this->curves);
  while( true ) {
    bVar1 = __gnu_cxx::operator!=
                      (&__end3,(__normal_iterator<const_std::pair<std::shared_ptr<Assimp::IFC::BoundedCurve>,_bool>_*,_std::vector<std::pair<std::shared_ptr<Assimp::IFC::BoundedCurve>,_bool>,_std::allocator<std::pair<std::shared_ptr<Assimp::IFC::BoundedCurve>,_bool>_>_>_>
                                *)&entry);
    if (!bVar1) break;
    range = (ParamRange *)
            __gnu_cxx::
            __normal_iterator<const_std::pair<std::shared_ptr<Assimp::IFC::BoundedCurve>,_bool>_*,_std::vector<std::pair<std::shared_ptr<Assimp::IFC::BoundedCurve>,_bool>,_std::allocator<std::pair<std::shared_ptr<Assimp::IFC::BoundedCurve>,_bool>_>_>_>
            ::operator*(&__end3);
    peVar3 = std::
             __shared_ptr_access<Assimp::IFC::BoundedCurve,_(__gnu_cxx::_Lock_policy)2,_false,_false>
             ::operator->((__shared_ptr_access<Assimp::IFC::BoundedCurve,_(__gnu_cxx::_Lock_policy)2,_false,_false>
                           *)range);
    (*(peVar3->super_Curve)._vptr_Curve[5])();
    local_58 = &delta;
    local_60 = local_c0;
    std::abs((int)peVar3);
    local_c0 = a;
    at = extraout_XMM0_Qa;
    if ((a <= (double)__range3 + extraout_XMM0_Qa) && ((double)__range3 <= b)) {
      local_80 = 0.0;
      bt = a - (double)__range3;
      pdVar4 = std::max<double>(&local_80,&bt);
      local_78 = *pdVar4;
      local_98 = b - (double)__range3;
      pdVar4 = std::min<double>(&at,&local_98);
      local_90 = *pdVar4;
      peVar3 = std::
               __shared_ptr_access<Assimp::IFC::BoundedCurve,_(__gnu_cxx::_Lock_policy)2,_false,_false>
               ::operator->((__shared_ptr_access<Assimp::IFC::BoundedCurve,_(__gnu_cxx::_Lock_policy)2,_false,_false>
                             *)range);
      if (((ulong)range[1].first & 1) == 0) {
        local_b0 = local_58[1] - local_90;
      }
      else {
        local_b0 = local_78 + *local_58;
      }
      if (((ulong)range[1].first & 1) == 0) {
        local_c0 = local_58[1] - local_78;
      }
      else {
        local_c0 = local_90 + *local_58;
      }
      iVar2 = (*(peVar3->super_Curve)._vptr_Curve[6])(local_b0);
      acc = (IfcFloat)(CONCAT44(extraout_var,iVar2) + (long)acc);
    }
    __range3 = (vector<std::pair<std::shared_ptr<Assimp::IFC::BoundedCurve>,_bool>,_std::allocator<std::pair<std::shared_ptr<Assimp::IFC::BoundedCurve>,_bool>_>_>
                *)(at + (double)__range3);
    __gnu_cxx::
    __normal_iterator<const_std::pair<std::shared_ptr<Assimp::IFC::BoundedCurve>,_bool>_*,_std::vector<std::pair<std::shared_ptr<Assimp::IFC::BoundedCurve>,_bool>,_std::allocator<std::pair<std::shared_ptr<Assimp::IFC::BoundedCurve>,_bool>_>_>_>
    ::operator++(&__end3);
  }
  return (size_t)acc;
}

Assistant:

size_t EstimateSampleCount(IfcFloat a, IfcFloat b) const {
        ai_assert( InRange( a ) );
        ai_assert( InRange( b ) );
        size_t cnt = 0;

        IfcFloat acc = 0;
        for(const CurveEntry& entry : curves) {
            const ParamRange& range = entry.first->GetParametricRange();
            const IfcFloat delta = std::abs(range.second-range.first);
            if (a <= acc+delta && b >= acc) {
                const IfcFloat at =  std::max(static_cast<IfcFloat>( 0. ),a-acc), bt = std::min(delta,b-acc);
                cnt += entry.first->EstimateSampleCount( entry.second ? at + range.first : range.second - bt, entry.second ? bt + range.first : range.second - at );
            }

            acc += delta;
        }

        return cnt;
    }